

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmund~.c
# Opt level: O0

void sigmund_getpitch(int npeak,t_peak_conflict *peakv,t_float *freqp,t_float npts,t_float srate,
                     t_float nharmonics,t_float amppower,int loud)

{
  float fVar1;
  long lVar2;
  float fVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  double dVar7;
  undefined8 uStack_150;
  float afStack_148 [2];
  double local_140;
  double local_138;
  float local_130;
  float local_12c;
  t_float weight;
  t_float inharm;
  t_float intpart;
  t_float harmonic;
  t_float thisfreq;
  t_float thisloudness;
  t_peak_conflict *thispeak_1;
  int ibest;
  int hiindex;
  int loindex;
  t_float subindex;
  t_float loudness;
  t_float weightindex;
  t_peak_conflict *thispeak;
  t_peak_conflict *ptStack_e8;
  t_float bestsalience;
  t_peak_conflict *bestpeak;
  size_t weight_len;
  t_peak_conflict *bigpeaks [12];
  t_float *weights;
  float local_60;
  t_float freq;
  t_float sumfreq;
  t_float sumweight;
  t_float sumamp;
  t_float bestweight;
  t_float bestbin;
  int nsalient;
  int k;
  int j;
  int i;
  int npit;
  t_float fperbin;
  int loud_local;
  t_float amppower_local;
  t_float nharmonics_local;
  t_float srate_local;
  t_float npts_local;
  t_float *freqp_local;
  t_peak_conflict *peakv_local;
  int npeak_local;
  
  fVar3 = (srate * 0.5) / npts;
  uStack_150 = 0x205612;
  uVar5 = sigmund_ilog2((int)npts);
  iVar6 = uVar5 * 0x30;
  bestpeak = (t_peak_conflict *)((long)iVar6 << 2);
  if ((t_peak_conflict *)0x10000 < (t_peak_conflict *)((long)iVar6 << 2)) {
    bestpeak = (t_peak_conflict *)0x10000;
  }
  lVar2 = -(long)bestpeak;
  lVar4 = lVar2 + -0x148;
  if (npeak < 1) {
    weights._4_4_ = 0.0;
  }
  else {
    for (k = 0; k < iVar6; k = k + 1) {
      *(undefined4 *)((long)afStack_148 + (long)k * 4 + lVar4 + 0x148) = 0;
    }
    for (k = 0; k < npeak; k = k + 1) {
      peakv[k].p_tmp = 0.0;
      peakv[k].p_salience = peakv[k].p_pit * -0.0 + peakv[k].p_db;
    }
    for (bestweight = 0.0; (int)bestweight < 0xc; bestweight = (t_float)((int)bestweight + 1)) {
      ptStack_e8 = (t_peak_conflict *)0x0;
      thispeak._4_4_ = -1e+20;
      for (nsalient = 0; nsalient < npeak; nsalient = nsalient + 1) {
        if (((peakv[nsalient].p_tmp == 0.0) && (!NAN(peakv[nsalient].p_tmp))) &&
           (thispeak._4_4_ < peakv[nsalient].p_salience)) {
          thispeak._4_4_ = peakv[nsalient].p_salience;
          ptStack_e8 = peakv + nsalient;
        }
      }
      if (ptStack_e8 == (t_peak_conflict *)0x0) break;
      bigpeaks[(long)(int)bestweight + -1] = ptStack_e8;
      ptStack_e8->p_tmp = 1.0;
    }
    freq = 0.0;
    for (k = 0; k < (int)bestweight; k = k + 1) {
      _loudness = bigpeaks[(long)k + -1];
      fVar1 = _loudness->p_freq;
      *(undefined8 *)((long)afStack_148 + lVar2 + -8) = 0x205880;
      dVar7 = log((double)fVar1 / ((double)fVar3 * 2.0));
      subindex = (t_float)(dVar7 * 69.24936196267028);
      fVar1 = _loudness->p_amp;
      *(undefined8 *)((long)afStack_148 + lVar2 + -8) = 0x2058b9;
      dVar7 = pow((double)fVar1,(double)amppower);
      loindex = (int)(float)dVar7;
      for (nsalient = 0; nsalient < 0x10; nsalient = nsalient + 1) {
        local_138 = (double)subindex;
        *(undefined8 *)((long)afStack_148 + lVar2 + -8) = 0x205900;
        dVar7 = log((double)nsalient + 1.0);
        hiindex = (int)(float)(dVar7 * -69.24936196267028 + local_138);
        ibest = (int)((float)hiindex - 0.5);
        thispeak_1._4_4_ = ibest + 2;
        if (thispeak_1._4_4_ < 0) break;
        if (thispeak_1._4_4_ < iVar6) {
          if (ibest < 0) {
            ibest = 0;
          }
          for (bestbin = (t_float)ibest; (int)bestbin <= thispeak_1._4_4_;
              bestbin = (t_float)((int)bestbin + 1)) {
            *(float *)((long)afStack_148 + (long)(int)bestbin * 4 + lVar4 + 0x148) =
                 ((float)loindex * nharmonics) / (nharmonics + (float)nsalient) +
                 *(float *)((long)afStack_148 + (long)(int)bestbin * 4 + lVar4 + 0x148);
          }
        }
      }
      freq = (float)loindex + freq;
    }
    sumamp = -1.0;
    sumweight = -1e+20;
    for (k = 0; k < iVar6; k = k + 1) {
      if (sumweight < *(float *)((long)afStack_148 + (long)k * 4 + lVar4 + 0x148)) {
        sumweight = *(t_float *)((long)afStack_148 + (long)k * 4 + lVar4 + 0x148);
        sumamp = (t_float)k;
      }
    }
    if (sumweight < freq * 0.4) {
      sumamp = -1.0;
    }
    if (0.0 <= sumamp) {
      if ((0.0 < sumamp) && (sumamp < (float)(iVar6 + -1))) {
        thispeak_1._0_4_ = (int)sumamp;
        sumamp = (*(float *)((long)afStack_148 + (long)((int)thispeak_1 + 1) * 4 + lVar4 + 0x148) -
                 *(float *)((long)afStack_148 + (long)((int)thispeak_1 + -1) * 4 + lVar4 + 0x148)) /
                 (*(float *)((long)afStack_148 + (long)((int)thispeak_1 + 1) * 4 + lVar4 + 0x148) +
                  *(float *)((long)afStack_148 + (long)(int)thispeak_1 * 4 + lVar4 + 0x148) +
                 *(float *)((long)afStack_148 + (long)((int)thispeak_1 + -1) * 4 + lVar4 + 0x148)) +
                 sumamp;
      }
      local_140 = (double)(fVar3 * 2.0);
      *(undefined8 *)((long)afStack_148 + lVar2 + -8) = 0x205b84;
      dVar7 = exp((double)sumamp * 0.01444056626166552);
      weights._4_4_ = (float)(local_140 * dVar7);
      local_60 = 0.0;
      freq = 0.0;
      for (k = 0; k < (int)bestweight; k = k + 1) {
        _thisfreq = bigpeaks[(long)k + -1];
        harmonic = _thisfreq->p_amp;
        intpart = _thisfreq->p_freq;
        inharm = intpart / weights._4_4_;
        weight = (t_float)(int)(inharm + 0.5);
        local_12c = inharm - weight;
        if (((1.0 <= weight) && (weight <= 16.0)) &&
           ((local_12c < weight * 0.015 && (-(weight * 0.015) < local_12c)))) {
          local_130 = _thisfreq->p_amp * weight;
          freq = local_130 + freq;
          local_60 = (local_130 * intpart) / weight + local_60;
        }
      }
      if (0.0 < freq) {
        weights._4_4_ = local_60 / freq;
      }
    }
    else {
      weights._4_4_ = 0.0;
    }
  }
  if ((weights._4_4_ < 0.0) && (0.0 < weights._4_4_)) {
    weights._4_4_ = 0.0;
  }
  *freqp = weights._4_4_;
  return;
}

Assistant:

static void sigmund_getpitch(int npeak, t_peak *peakv, t_float *freqp,
    t_float npts, t_float srate, t_float nharmonics, t_float amppower, int loud)
{
    t_float fperbin = 0.5 * srate / npts;
    int npit = 48 * sigmund_ilog2(npts), i, j, k, nsalient;
    t_float bestbin, bestweight, sumamp, sumweight, sumfreq, freq;
    t_float *weights =  0;
    t_peak *bigpeaks[PITCHNPEAK];
    size_t weight_len = sizeof(t_float) * npit;
    if(weight_len > 65536)
      weight_len = 65536;
    weights = (t_float *)alloca(weight_len);
    if (npeak < 1)
    {
        freq = 0;
        goto done;
    }
    for (i = 0; i < npit; i++)
        weights[i] = 0;
    for (i = 0; i < npeak; i++)
    {
        peakv[i].p_tmp = 0;
        peakv[i].p_salience = peakv[i].p_db - DBPERHALFTONE * peakv[i].p_pit;
    }
    for (nsalient = 0; nsalient < PITCHNPEAK; nsalient++)
    {
        t_peak *bestpeak = 0;
        t_float bestsalience = -1e20;
        for (j = 0; j < npeak; j++)
            if (peakv[j].p_tmp == 0 && peakv[j].p_salience > bestsalience)
        {
            bestsalience = peakv[j].p_salience;
            bestpeak = &peakv[j];
        }
        if (!bestpeak)
            break;
        bigpeaks[nsalient] = bestpeak;
        bestpeak->p_tmp = 1;
        /* post("peak f=%f a=%f", bestpeak->p_freq, bestpeak->p_amp); */
    }
    sumweight = 0;
    for (i = 0; i < nsalient; i++)
    {
        t_peak *thispeak = bigpeaks[i];
        t_float weightindex = (48./LOG2) *
            log(thispeak->p_freq/(2.*fperbin));
        t_float loudness = pow(thispeak->p_amp, amppower);
        /* post("index %f, uncertainty %f", weightindex, pitchuncertainty); */
        for (j = 0; j < SUBHARMONICS; j++)
        {
            t_float subindex = weightindex -
                (48./LOG2) * log(j + 1.);
            int loindex = subindex - 0.5;
            int hiindex = loindex+2;
            if (hiindex < 0)
                break;
            if (hiindex >= npit)
                continue;
            if (loindex < 0)
                loindex = 0;
            for (k = loindex; k <= hiindex; k++)
                weights[k] += loudness * nharmonics / (nharmonics + j);
        }
        sumweight += loudness;
    }
    bestbin = -1;
    bestweight = -1e20;
    for (i = 0; i < npit; i++)
        if (weights[i] > bestweight)
            bestweight = weights[i], bestbin = i;
    if (bestweight < sumweight * 0.4)
        bestbin = -1;
    
    if (bestbin < 0)
    {
        freq = 0;
        goto done;
    }
    if (bestbin > 0 && bestbin < npit-1)
    {
        int ibest = bestbin;
        bestbin += (weights[ibest+1] - weights[ibest-1]) /
            (weights[ibest+1] +  weights[ibest] + weights[ibest-1]);
    }
    freq = 2*fperbin * exp((LOG2/48.)*bestbin);
    for (sumamp = sumweight = sumfreq = 0, i = 0; i < nsalient; i++)
    {
        t_peak *thispeak = bigpeaks[i];
        t_float thisloudness = thispeak->p_amp;
        t_float thisfreq = thispeak->p_freq;
        t_float harmonic = thisfreq/freq;
        t_float intpart = (int)(0.5 + harmonic);
        t_float inharm = harmonic - intpart;
#if 0
        if (loud)
            post("freq %f intpart %f inharm %f", freq, intpart, inharm);
#endif
        if (intpart >= 1 && intpart <= 16 &&
            inharm < 0.015 * intpart && inharm > - (0.015 * intpart))
        {
            t_float weight = thisloudness * intpart;
            sumweight += weight;
            sumfreq += weight*thisfreq/intpart;
#if 0
            if (loud)
                post("weight %f freq %f", weight, thisfreq);
#endif
        }
    }
    if (sumweight > 0)
        freq = sumfreq / sumweight;
done:
    if (!(freq >= 0 || freq <= 0))
    {
        /* post("freq nan cancelled"); */
        freq = 0;
    }
    *freqp = freq;
}